

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

Regexp * __thiscall duckdb_re2::Regexp::Simplify(Regexp *this)

{
  bool bVar1;
  Regexp *pRVar2;
  Regexp *sre;
  SimplifyWalker sw;
  Regexp *cre;
  CoalesceWalker cw;
  Regexp *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  _Elt_pointer in_stack_ffffffffffffff40;
  Walker<duckdb_re2::Regexp_*> local_70;
  Regexp *local_8;
  
  CoalesceWalker::CoalesceWalker
            ((CoalesceWalker *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  pRVar2 = Walker<duckdb_re2::Regexp_*>::Walk
                     ((Walker<duckdb_re2::Regexp_*> *)
                      CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                      in_stack_fffffffffffffed8,(Regexp *)0x84f131);
  if (pRVar2 == (Regexp *)0x0) {
    local_8 = (Regexp *)0x0;
  }
  else {
    bVar1 = Walker<duckdb_re2::Regexp_*>::stopped_early(&local_70);
    if (bVar1) {
      Decref((Regexp *)in_stack_ffffffffffffff40);
      local_8 = (Regexp *)0x0;
    }
    else {
      SimplifyWalker::SimplifyWalker
                ((SimplifyWalker *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
      pRVar2 = Walker<duckdb_re2::Regexp_*>::Walk
                         ((Walker<duckdb_re2::Regexp_*> *)
                          CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffed8,(Regexp *)0x84f1ef);
      Decref((Regexp *)in_stack_ffffffffffffff40);
      if (pRVar2 == (Regexp *)0x0) {
        local_8 = (Regexp *)0x0;
      }
      else {
        bVar1 = Walker<duckdb_re2::Regexp_*>::stopped_early
                          ((Walker<duckdb_re2::Regexp_*> *)&stack0xffffffffffffff18);
        local_8 = pRVar2;
        if (bVar1) {
          Decref((Regexp *)in_stack_ffffffffffffff40);
          local_8 = (Regexp *)0x0;
        }
      }
      SimplifyWalker::~SimplifyWalker((SimplifyWalker *)0x84f2b1);
    }
  }
  CoalesceWalker::~CoalesceWalker((CoalesceWalker *)0x84f2be);
  return local_8;
}

Assistant:

Regexp* Regexp::Simplify() {
  CoalesceWalker cw;
  Regexp* cre = cw.Walk(this, NULL);
  if (cre == NULL)
    return NULL;
  if (cw.stopped_early()) {
    cre->Decref();
    return NULL;
  }
  SimplifyWalker sw;
  Regexp* sre = sw.Walk(cre, NULL);
  cre->Decref();
  if (sre == NULL)
    return NULL;
  if (sw.stopped_early()) {
    sre->Decref();
    return NULL;
  }
  return sre;
}